

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * createpsbt(void)

{
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  RPCExamples *in_stack_fffffffffffffd68;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd70;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffd78;
  string *args;
  string *methodname;
  allocator<char> *in_stack_fffffffffffffda8;
  allocator<char> *__a;
  char *in_stack_fffffffffffffdb0;
  allocator<char> *__s;
  RPCHelpMan *this_00;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  RPCHelpMan *result;
  undefined4 in_stack_fffffffffffffde8;
  Type in_stack_fffffffffffffdec;
  RPCResult *in_stack_fffffffffffffdf0;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  undefined1 local_1e8 [30];
  undefined1 local_1ca [56];
  allocator<char> local_192;
  allocator<char> local_191 [65];
  RPCExamples *in_stack_fffffffffffffeb0;
  RPCResults *in_stack_fffffffffffffeb8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  RPCHelpMan *in_stack_fffffffffffffed8;
  RPCMethodImpl *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  skip_type_check = (undefined1)((ulong)local_191 >> 0x38);
  this_00 = in_RDI;
  result = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this_00->m_name,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  __s = &local_192;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this_00->m_name,(char *)__s,in_stack_fffffffffffffda8);
  CreateTxDoc();
  __a = (allocator<char> *)(local_1ca + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_00->m_name,(char *)__s,__a);
  methodname = (string *)local_1ca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_00->m_name,(char *)__s,__a);
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = (pointer)0x0;
  local_1e8._16_8_ = 0;
  args = (string *)local_1e8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffd68);
  RPCResult::RPCResult
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,&result->m_name,
             in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(bool)skip_type_check);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             (RPCResult *)result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_00->m_name,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_00->m_name,(char *)__s,__a);
  HelpExampleCli(methodname,args);
  RPCExamples::RPCExamples(in_stack_fffffffffffffd68,(string *)0x13acc0b);
  this = (RPCResult *)&stack0xfffffffffffffdf0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<createpsbt()::__0,void>
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             in_stack_ffffffffffffffd0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1ea);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1e9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffd78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_1ca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_1ca + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffd78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_192);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_191);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createpsbt()
{
    return RPCHelpMan{"createpsbt",
                "\nCreates a transaction in the Partially Signed Transaction format.\n"
                "Implements the Creator role.\n",
                CreateTxDoc(),
                RPCResult{
                    RPCResult::Type::STR, "", "The resulting raw transaction (base64-encoded string)"
                },
                RPCExamples{
                    HelpExampleCli("createpsbt", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{

    std::optional<bool> rbf;
    if (!request.params[3].isNull()) {
        rbf = request.params[3].get_bool();
    }
    CMutableTransaction rawTx = ConstructTransaction(request.params[0], request.params[1], request.params[2], rbf);

    // Make a blank psbt
    PartiallySignedTransaction psbtx;
    psbtx.tx = rawTx;
    for (unsigned int i = 0; i < rawTx.vin.size(); ++i) {
        psbtx.inputs.emplace_back();
    }
    for (unsigned int i = 0; i < rawTx.vout.size(); ++i) {
        psbtx.outputs.emplace_back();
    }

    // Serialize the PSBT
    DataStream ssTx{};
    ssTx << psbtx;

    return EncodeBase64(ssTx);
},
    };
}